

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,sunrealtype droptol,int sparsetype)

{
  double dVar1;
  sunindextype *psVar2;
  sunindextype M;
  void *pvVar3;
  SUNMatrix p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  sunindextype N;
  
  psVar2 = (sunindextype *)Ad->content;
  M = *psVar2;
  N = psVar2[1];
  lVar6 = 0;
  lVar8 = 0;
  if (0 < M) {
    lVar8 = M;
  }
  lVar9 = 0;
  if (0 < N) {
    lVar9 = N;
  }
  for (lVar5 = 0; lVar5 != lVar9; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
      lVar6 = lVar6 + (ulong)(droptol <
                             ABS(*(double *)(*(long *)(psVar2[4] + lVar5 * 8) + lVar7 * 8)));
    }
  }
  p_Var4 = SUNSparseMatrix(M,N,lVar6,sparsetype,Ad->sunctx);
  lVar6 = 0;
  lVar5 = 0;
  if (sparsetype == 0) {
    for (; lVar5 != lVar9; lVar5 = lVar5 + 1) {
      pvVar3 = p_Var4->content;
      *(long *)(*(long *)((long)pvVar3 + 0x38) + lVar5 * 8) = lVar6;
      for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
        dVar1 = *(double *)(*(long *)(*(long *)((long)Ad->content + 0x20) + lVar5 * 8) + lVar7 * 8);
        if (droptol < ABS(dVar1)) {
          *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8) = lVar7;
          *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar6 * 8) = dVar1;
          lVar6 = lVar6 + 1;
        }
      }
    }
  }
  else {
    for (; N = M, lVar5 != lVar8; lVar5 = lVar5 + 1) {
      pvVar3 = p_Var4->content;
      *(long *)(*(long *)((long)pvVar3 + 0x38) + lVar5 * 8) = lVar6;
      for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
        dVar1 = *(double *)(*(long *)(*(long *)((long)Ad->content + 0x20) + lVar7 * 8) + lVar5 * 8);
        if (droptol < ABS(dVar1)) {
          *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar6 * 8) = lVar7;
          *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar6 * 8) = dVar1;
          lVar6 = lVar6 + 1;
        }
      }
    }
  }
  *(long *)(*(long *)((long)p_Var4->content + 0x38) + N * 8) = lVar6;
  return p_Var4;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, sunrealtype droptol,
                                   int sparsetype)
{
  SUNFunctionBegin(Ad->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ad) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = 0; i < M; i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = NULL;
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ad->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = 0; i < M; i++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = 0; j < N; j++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}